

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SpectrumPtexTexture *
pbrt::SpectrumPtexTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  SpectrumPtexTexture *pSVar1;
  ColorEncodingHandle encoding;
  string encodingString;
  string filename;
  allocator<char> local_9e;
  allocator<char> local_9d;
  SpectrumType local_9c;
  string local_98;
  string local_78;
  string local_58;
  polymorphic_allocator<std::byte> local_38;
  string local_30;
  
  local_9c = spectrumType;
  local_38.memoryResource = alloc.memoryResource;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"filename",&local_9d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_9e);
  TextureParameterDictionary::GetOneString(&local_58,parameters,&local_98,&local_78);
  ResolveFilename(&local_30,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"encoding",&local_9d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"gamma 2.2",&local_9e);
  TextureParameterDictionary::GetOneString(&local_58,parameters,&local_98,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  ColorEncodingHandle::Get(&local_98,(memory_resource *)&local_58);
  pSVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SpectrumPtexTexture,std::__cxx11::string&,pbrt::ColorEncodingHandle&,pbrt::SpectrumType&>
                     (&local_38,&local_30,(ColorEncodingHandle *)&local_98,&local_9c);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_30);
  return pSVar1;
}

Assistant:

SpectrumPtexTexture *SpectrumPtexTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
    std::string encodingString = parameters.GetOneString("encoding", "gamma 2.2");
    ColorEncodingHandle encoding = ColorEncodingHandle::Get(encodingString, alloc);
    return alloc.new_object<SpectrumPtexTexture>(filename, encoding, spectrumType);
}